

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyTest::Test<1u>(CopyTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLenum target;
  bool result;
  CopyTest *this_local;
  
  CreateAll<1u>(this);
  bVar1 = CopyTextureSubImage1DAndCheckErrors(this,this->m_to_dst,0,0,0,0,2);
  bVar2 = CopyTextureSubImage1DAndCheckErrors(this,this->m_to_dst,0,2,2,0,2);
  target = TextureTarget<1u>(this);
  bVar3 = CheckData(this,target,0x10);
  CleanAll(this);
  return (bVar1 && bVar2) && bVar3;
}

Assistant:

bool CopyTest::Test<1>()
{
	CreateAll<1>();

	bool result = true;

	result &= CopyTextureSubImage1DAndCheckErrors(m_to_dst, 0, 0, 0, 0, s_texture_width / 2);
	result &= CopyTextureSubImage1DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, s_texture_width / 2, 0,
												  s_texture_width / 2);

	result &= CheckData(TextureTarget<1>(), 4 /* RGBA */ * s_texture_width);

	CleanAll();

	return result;
}